

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  blowfish_ctx *ctx;
  int len_local;
  void *blk_local;
  ssh_cipher *cipher_local;
  
  blowfish_lsb_decrypt_cbc((uchar *)blk,len,(BlowfishContext *)(cipher + -0x20a));
  return;
}

Assistant:

static void blowfish_ssh1_decrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_lsb_decrypt_cbc(blk, len, &ctx->context);
}